

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O2

void __thiscall QGridLayoutPrivate::recalcHFW(QGridLayoutPrivate *this,int w)

{
  int iVar1;
  QLayoutStruct *pQVar2;
  QList<QLayoutStruct> *this_00;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  
  if (this->hfwData == (QList<QLayoutStruct> *)0x0) {
    this_00 = (QList<QLayoutStruct> *)operator_new(0x18);
    QList<QLayoutStruct>::QList(this_00,(long)this->rr);
    this->hfwData = this_00;
  }
  setupHfwLayoutData(this);
  uVar4 = 0;
  uVar3 = (ulong)(uint)this->rr;
  if (this->rr < 1) {
    uVar3 = uVar4;
  }
  iVar6 = 0;
  iVar5 = 0;
  for (; uVar3 * 0x20 != uVar4; uVar4 = uVar4 + 0x20) {
    pQVar2 = (this->hfwData->d).ptr;
    iVar1 = *(int *)((long)&pQVar2->spacing + uVar4);
    iVar6 = iVar6 + iVar1 + *(int *)((long)&pQVar2->sizeHint + uVar4);
    iVar5 = iVar5 + iVar1 + *(int *)((long)&pQVar2->minimumSize + uVar4);
  }
  this->hfw_width = w;
  if (0x7fffe < iVar6) {
    iVar6 = 0x7ffff;
  }
  this->hfw_height = iVar6;
  iVar6 = 0x7ffff;
  if (iVar5 < 0x7ffff) {
    iVar6 = iVar5;
  }
  this->hfw_minheight = iVar6;
  return;
}

Assistant:

void QGridLayoutPrivate::recalcHFW(int w)
{
    /*
      Go through all children, using colData and heightForWidth()
      and put the results in hfwData.
    */
    if (!hfwData)
        hfwData = new QList<QLayoutStruct>(rr);
    setupHfwLayoutData();
    QList<QLayoutStruct> &rData = *hfwData;

    int h = 0;
    int mh = 0;
    for (int r = 0; r < rr; r++) {
        int spacing = rData.at(r).spacing;
        h += rData.at(r).sizeHint + spacing;
        mh += rData.at(r).minimumSize + spacing;
    }

    hfw_width = w;
    hfw_height = qMin(QLAYOUTSIZE_MAX, h);
    hfw_minheight = qMin(QLAYOUTSIZE_MAX, mh);
}